

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::
ExceptionOr<kj::Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>_>
::~ExceptionOr(ExceptionOr<kj::Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>_>
               *this)

{
  PromiseNode *pPVar1;
  Disposer *pDVar2;
  
  if (((this->value).ptr.isSet == true) &&
     (pPVar1 = (this->value).ptr.field_1.value.super_PromiseBase.node.ptr,
     pPVar1 != (PromiseNode *)0x0)) {
    (this->value).ptr.field_1.value.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    pDVar2 = (this->value).ptr.field_1.value.super_PromiseBase.node.disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(_func_int *)
                      ((long)&pPVar1->_vptr_PromiseNode + (long)pPVar1->_vptr_PromiseNode[-2]));
  }
  if ((this->super_ExceptionOrValue).exception.ptr.isSet == true) {
    Exception::~Exception(&(this->super_ExceptionOrValue).exception.ptr.field_1.value);
    return;
  }
  return;
}

Assistant:

ExceptionOr() = default;